

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O1

int ncnn::conv3x3s1_winograd43_int8(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sVar10;
  undefined1 auVar11 [32];
  void *pvVar12;
  Option *pOVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  Mat *pMVar32;
  int iVar34;
  long lVar35;
  undefined1 (*pauVar36) [64];
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [16];
  int *piVar39;
  int *piVar40;
  int *piVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  undefined1 (*pauVar47) [64];
  int iVar48;
  undefined1 (*pauVar49) [32];
  int iVar50;
  int iVar51;
  uint uVar52;
  undefined1 (*pauVar53) [16];
  int m_3;
  int iVar54;
  long lVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  int tmp [4] [6] [2];
  Allocator *_allocator;
  int local_8ec;
  ulong local_8e8;
  ulong local_8e0;
  Option *local_8d8;
  uint local_8cc;
  ulong local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  int *local_8b0;
  int local_8a4;
  Mat *local_8a0;
  long local_898;
  void *local_890;
  void *local_888;
  int *local_880;
  undefined1 *local_878;
  ulong local_870;
  ulong local_868;
  ulong local_860;
  Mat *local_858;
  ulong local_850;
  int local_848;
  uint local_844;
  Mat local_840;
  ulong local_7f8;
  ulong local_7f0;
  void *local_7e8;
  long local_7e0;
  int local_7d8;
  int local_7d4;
  undefined8 local_7d0;
  ulong local_7c8;
  Mat local_7c0;
  Mat local_770;
  ulong local_728;
  size_t local_720;
  int local_714;
  ulong local_710;
  long local_708;
  Mat local_700;
  ulong local_6b0;
  void *local_6a8;
  long local_6a0;
  void *local_698;
  ulong local_690;
  Mat *local_688;
  Mat local_680;
  int aiStack_638 [2];
  undefined1 auStack_630 [16];
  int aiStack_620 [16];
  undefined1 auStack_5e0 [24];
  int aiStack_5c8 [22];
  undefined1 aauStack_570 [3] [16];
  undefined1 local_540 [48];
  undefined1 aauStack_510 [11] [16];
  undefined1 local_460 [5] [32];
  undefined1 local_3c0 [384];
  undefined1 local_240 [6] [64];
  undefined1 local_c0 [2] [64];
  undefined4 uVar33;
  
  pMVar32 = top_blob;
  iVar15 = cpu_support_x86_avx512_vnni();
  uVar33 = (undefined4)((ulong)pMVar32 >> 0x20);
  if (iVar15 != 0) {
    iVar15 = conv3x3s1_winograd43_int8_avx512vnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar15;
  }
  iVar15 = cpu_support_x86_avx_vnni();
  if (iVar15 != 0) {
    iVar15 = conv3x3s1_winograd43_int8_avxvnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar15;
  }
  uVar4 = top_blob->w;
  uVar5 = top_blob->h;
  auVar69._4_4_ = uVar5;
  auVar69._0_4_ = uVar4;
  auVar57._8_4_ = 3;
  auVar57._0_8_ = 0x300000003;
  auVar57._12_4_ = 3;
  auVar69._8_8_ = 0;
  auVar57 = vpaddd_avx512vl(auVar69,auVar57);
  auVar69 = vpsrad_avx(auVar57,0x1f);
  auVar69 = vpsrld_avx(auVar69,0x1e);
  auVar57 = vpaddd_avx(auVar57,auVar69);
  auVar69 = vpsrad_avx(auVar57,2);
  auVar57 = vpshufd_avx(auVar69,0x55);
  auVar57 = vpmulld_avx(auVar57,auVar69);
  uVar31 = top_blob->elempack * top_blob->c;
  iVar26 = auVar57._0_4_;
  uVar52 = bottom_blob->elempack * bottom_blob->c;
  local_8c0 = CONCAT44(local_8c0._4_4_,nT);
  local_8d8 = opt;
  local_8a0 = top_blob;
  local_858 = bottom_blob;
  local_688 = AT;
  get_optimal_tile_mnk_int8(uVar31,iVar26,uVar52,(int *)&local_844,(int *)&local_8cc,&local_8ec,nT);
  pOVar13 = local_8d8;
  local_7d8 = (int)(uVar31 + local_844 + -1) / (int)local_844;
  iVar50 = (int)(local_8cc + iVar26 + -1) / (int)local_8cc;
  iVar16 = (int)(uVar52 + local_8ec + -1) / local_8ec;
  iVar15 = local_8ec * local_8cc;
  _allocator = local_8d8->workspace_allocator;
  local_770.cstep = 0;
  local_770.data = (void *)0x0;
  local_770.refcount._0_4_ = 0;
  local_770.refcount._4_4_ = 0;
  local_770.elemsize = 0;
  local_770.elempack = 0;
  local_770.allocator = (Allocator *)0x0;
  local_770.dims = 0;
  local_770.w = 0;
  local_770.h = 0;
  local_770.d = 0;
  local_770.c = 0;
  local_7f8 = (ulong)uVar52;
  local_7d0 = CONCAT44(uVar33,iVar26);
  local_6b0 = (ulong)uVar31;
  Mat::create(&local_770,iVar15,0x24,iVar16,iVar50,4,_allocator);
  iVar26 = -100;
  if ((local_770.data == (void *)0x0) || ((long)local_770.c * local_770.cstep == 0))
  goto LAB_001ab076;
  iVar50 = iVar50 * iVar16;
  iVar15 = iVar15 * 0x24;
  if (((int)local_8c0 < 2) || ((int)local_8c0 <= iVar50)) {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize._0_4_ = 0;
    local_680.elemsize._4_4_ = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar15,1,(int)local_8c0,4,pOVar13->workspace_allocator);
    bVar56 = (long)local_680.c * local_680.cstep == 0;
    if (local_680.data != (void *)0x0 && !bVar56) {
      local_8b0 = (int *)CONCAT71(local_8b0._1_7_,local_680.data == (void *)0x0 || bVar56);
      if (0 < iVar50) {
        iVar15 = 0;
        do {
          iVar26 = local_8cc * (iVar15 / iVar16);
          iVar42 = local_8ec * (iVar15 % iVar16);
          uVar31 = (int)local_7d0 - iVar26;
          if ((int)local_8cc < (int)uVar31) {
            uVar31 = local_8cc;
          }
          iVar51 = (int)local_7f8 - iVar42;
          if (local_8ec < iVar51) {
            iVar51 = local_8ec;
          }
          iVar17 = get_omp_thread_num();
          local_840.elemsize = CONCAT44(local_680.elemsize._4_4_,(undefined4)local_680.elemsize);
          local_840.data =
               (void *)((long)iVar17 * local_680.cstep * local_840.elemsize + (long)local_680.data);
          local_840.refcount._0_4_ = 0;
          local_840.refcount._4_4_ = 0;
          local_840.elempack = local_680.elempack;
          local_840.allocator = local_680.allocator;
          local_840.w = local_680.w;
          local_840.h = local_680.h;
          local_840.d = 1;
          local_840.c = local_680.d;
          local_840.dims = local_680.dims + -1;
          local_840.cstep =
               (local_840.elemsize * (long)local_680.h * (long)local_680.w + 0xf &
               0xfffffffffffffff0) / local_840.elemsize;
          if (local_680.dims == 4) {
            local_840.cstep = (long)local_680.h * (long)local_680.w;
          }
          conv3x3s1_winograd43_transform_input_tile_int8
                    (local_858,&local_840,iVar26,uVar31,iVar42,iVar51,(int)_allocator);
          local_7c0.cstep = (long)local_770.h * (long)local_770.w;
          local_7c0.data =
               (void *)((long)local_770.data +
                       (uint)(iVar15 % iVar16) * local_770.elemsize * local_7c0.cstep +
                       (long)(iVar15 / iVar16) * local_770.cstep * local_770.elemsize);
          local_7c0.refcount._0_4_ = 0;
          local_7c0.refcount._4_4_ = 0;
          local_7c0.elemsize = local_770.elemsize;
          local_7c0.elempack = local_770.elempack;
          local_7c0.allocator = local_770.allocator;
          local_7c0.dims = 2;
          local_7c0.w = local_770.w;
          local_7c0.h = local_770.h;
          local_7c0.d = 1;
          local_7c0.c = 1;
          transpose_pack_B_tile_int8(&local_840,&local_7c0,0x24,uVar31,iVar51,(int)local_7c0.cstep);
          piVar40 = (int *)CONCAT44(local_7c0.refcount._4_4_,local_7c0.refcount._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              if (local_7c0.allocator == (Allocator *)0x0) {
                if (local_7c0.data != (void *)0x0) {
                  free(local_7c0.data);
                }
              }
              else {
                (*(local_7c0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_7c0.cstep = 0;
          local_7c0.data = (void *)0x0;
          local_7c0.refcount._0_4_ = 0;
          local_7c0.refcount._4_4_ = 0;
          local_7c0.elemsize = 0;
          local_7c0.elempack = 0;
          local_7c0.dims = 0;
          local_7c0.w = 0;
          local_7c0.h = 0;
          local_7c0.d = 0;
          local_7c0.c = 0;
          piVar40 = (int *)CONCAT44(local_840.refcount._4_4_,local_840.refcount._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              if (local_840.allocator == (Allocator *)0x0) {
                if (local_840.data != (void *)0x0) {
                  free(local_840.data);
                }
              }
              else {
                (*(local_840.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_840.cstep = 0;
          local_840.data = (void *)0x0;
          local_840.refcount._0_4_ = 0;
          local_840.refcount._4_4_ = 0;
          local_840.elemsize = 0;
          local_840.elempack = 0;
          local_840.dims = 0;
          local_840.w = 0;
          local_840.h = 0;
          local_840.d = 0;
          local_840.c = 0;
          iVar15 = iVar15 + 1;
        } while (iVar50 != iVar15);
      }
      piVar40 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      if (piVar40 != (int *)0x0) {
        LOCK();
        *piVar40 = *piVar40 + -1;
        UNLOCK();
        if (*piVar40 == 0) {
          if (local_680.allocator == (Allocator *)0x0) {
            if (local_680.data != (void *)0x0) {
              free(local_680.data);
            }
          }
          else {
            (*(local_680.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      cVar14 = (char)local_8b0;
      goto LAB_001a8e94;
    }
    piVar40 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (local_680.allocator == (Allocator *)0x0) goto LAB_001a8dc6;
        (*(local_680.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize._0_4_ = 0;
    local_680.elemsize._4_4_ = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar15,4,pOVar13->workspace_allocator);
    bVar56 = (long)local_680.c * local_680.cstep == 0;
    cVar14 = local_680.data == (void *)0x0 || bVar56;
    if (local_680.data != (void *)0x0 && !bVar56) {
      if (0 < iVar50) {
        iVar15 = 0;
        do {
          iVar26 = local_8cc * (iVar15 / iVar16);
          iVar42 = local_8ec * (iVar15 % iVar16);
          uVar31 = (int)local_7d0 - iVar26;
          if ((int)local_8cc < (int)uVar31) {
            uVar31 = local_8cc;
          }
          iVar51 = (int)local_7f8 - iVar42;
          if (local_8ec < iVar51) {
            iVar51 = local_8ec;
          }
          conv3x3s1_winograd43_transform_input_tile_int8
                    (local_858,&local_680,iVar26,uVar31,iVar42,iVar51,(int)_allocator);
          local_840.cstep = (long)local_770.h * (long)local_770.w;
          local_840.data =
               (void *)((long)local_770.data +
                       (uint)(iVar15 % iVar16) * local_770.elemsize * local_840.cstep +
                       (long)(iVar15 / iVar16) * local_770.cstep * local_770.elemsize);
          local_840.refcount._0_4_ = 0;
          local_840.refcount._4_4_ = 0;
          local_840.elemsize = local_770.elemsize;
          local_840.elempack = local_770.elempack;
          local_840.allocator = local_770.allocator;
          local_840.dims = 2;
          local_840.w = local_770.w;
          local_840.h = local_770.h;
          local_840.d = 1;
          local_840.c = 1;
          transpose_pack_B_tile_int8(&local_680,&local_840,0x24,uVar31,iVar51,(int)local_840.cstep);
          piVar40 = (int *)CONCAT44(local_840.refcount._4_4_,local_840.refcount._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              if (local_840.allocator == (Allocator *)0x0) {
                if (local_840.data != (void *)0x0) {
                  free(local_840.data);
                }
              }
              else {
                (*(local_840.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_840.cstep = 0;
          local_840.data = (void *)0x0;
          local_840.refcount._0_4_ = 0;
          local_840.refcount._4_4_ = 0;
          local_840.elemsize = 0;
          local_840.elempack = 0;
          local_840.dims = 0;
          local_840.w = 0;
          local_840.h = 0;
          local_840.d = 0;
          local_840.c = 0;
          iVar15 = iVar15 + 1;
        } while (iVar50 != iVar15);
      }
      piVar40 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      if (piVar40 != (int *)0x0) {
        LOCK();
        *piVar40 = *piVar40 + -1;
        UNLOCK();
        if (*piVar40 == 0) {
          if (local_680.allocator == (Allocator *)0x0) {
            if (local_680.data != (void *)0x0) {
              free(local_680.data);
            }
          }
          else {
            (*(local_680.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_001a8e94:
      local_680.cstep = 0;
      local_680.c = 0;
      local_680.d = 0;
      local_680.h = 0;
      local_680.w = 0;
      local_680.dims = 0;
      local_680.elempack = 0;
      local_680.elemsize._4_4_ = 0;
      local_680.elemsize._0_4_ = 0;
      local_680.refcount._4_4_ = 0;
      local_680.refcount._0_4_ = 0;
      local_680.data = (void *)0x0;
      iVar26 = -100;
      if (cVar14 == '\0') {
        local_840.cstep = 0;
        local_840.data = (void *)0x0;
        local_840.refcount._0_4_ = 0;
        local_840.refcount._4_4_ = 0;
        local_840.elemsize = 0;
        local_840.elempack = 0;
        local_840.allocator = (Allocator *)0x0;
        local_840.dims = 0;
        local_840.w = 0;
        local_840.h = 0;
        local_840.d = 0;
        local_840.c = 0;
        Mat::create(&local_840,local_8cc * local_844 * 0x24,1,(int)local_8c0,4,
                    local_8d8->workspace_allocator);
        iVar26 = -100;
        if ((local_840.data != (void *)0x0) && ((long)local_840.c * local_840.cstep != 0)) {
          if (0 < local_7d8) {
            local_848 = 0;
            do {
              uVar31 = local_844;
              iVar15 = get_omp_thread_num();
              local_7c0.data =
                   (void *)((long)iVar15 * local_840.cstep * local_840.elemsize +
                           (long)local_840.data);
              local_7c0.refcount._0_4_ = 0;
              local_7c0.refcount._4_4_ = 0;
              local_7c0.elemsize = local_840.elemsize;
              local_7c0.elempack = local_840.elempack;
              local_7c0.allocator = local_840.allocator;
              local_7c0.w = local_840.w;
              local_7c0.h = local_840.h;
              local_7c0.d = 1;
              local_7c0.c = local_840.d;
              local_7c0.dims = local_840.dims + -1;
              local_7c0.cstep =
                   (local_840.elemsize * (long)local_840.h * (long)local_840.w + 0xf &
                   0xfffffffffffffff0) / local_840.elemsize;
              if (local_840.dims == 4) {
                local_7c0.cstep = (long)local_840.h * (long)local_840.w;
              }
              uVar22 = uVar31 * local_848;
              local_7f0 = (ulong)uVar22;
              uVar52 = (int)local_6b0 - uVar22;
              if ((int)uVar31 < (int)uVar52) {
                uVar52 = uVar31;
              }
              auVar61 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
              if (0 < (int)local_7d0) {
                local_690 = (ulong)uVar52;
                local_7c8 = (ulong)(int)uVar52;
                local_708 = (long)(int)uVar22;
                uVar21 = 0;
                do {
                  uVar31 = (int)local_7d0 - (int)uVar21;
                  if ((int)local_8cc < (int)uVar31) {
                    uVar31 = local_8cc;
                  }
                  local_850 = (ulong)uVar31;
                  local_860 = uVar21;
                  if (0 < (int)local_7f8) {
                    iVar15 = 0;
                    do {
                      iVar26 = (int)local_7f8 - iVar15;
                      if (local_8ec < iVar26) {
                        iVar26 = local_8ec;
                      }
                      local_680.w = local_688->w;
                      sVar10 = local_688->elemsize;
                      local_680.h = local_688->h;
                      local_680.elempack = local_688->elempack;
                      local_680.allocator = local_688->allocator;
                      local_680.cstep = (long)local_680.h * (long)local_680.w;
                      local_680.data =
                           (void *)((long)local_688->data +
                                   sVar10 * local_680.cstep * (long)(iVar15 / local_8ec) +
                                   (long)(int)((long)((ulong)(uint)((int)local_7f0 >> 0x1f) << 0x20
                                                     | local_7f0 & 0xffffffff) /
                                              (long)(int)local_844) * local_688->cstep * sVar10);
                      local_680.refcount._0_4_ = 0;
                      local_680.refcount._4_4_ = 0;
                      local_680.elemsize._0_4_ = (undefined4)sVar10;
                      local_680.elemsize._4_4_ = (int)(sVar10 >> 0x20);
                      local_680.dims = 2;
                      local_680.d = 1;
                      local_680.c = 1;
                      local_700.cstep = (long)local_770.h * (long)local_770.w;
                      local_700.data =
                           (void *)((long)local_770.data +
                                   local_770.elemsize * local_700.cstep * (long)(iVar15 / local_8ec)
                                   + (long)(int)((long)((ulong)(uint)((int)local_860 >> 0x1f) <<
                                                        0x20 | local_860 & 0xffffffff) /
                                                (long)(int)local_8cc) * local_770.cstep *
                                     local_770.elemsize);
                      local_700.refcount._0_4_ = 0;
                      local_700.refcount._4_4_ = 0;
                      local_700.elemsize = local_770.elemsize;
                      local_700.elempack = local_770.elempack;
                      local_700.allocator = local_770.allocator;
                      local_700.dims = 2;
                      local_700.w = local_770.w;
                      local_700.h = local_770.h;
                      local_700.d = 1;
                      local_700.c = 1;
                      gemm_transB_packed_tile_int8
                                (&local_680,&local_700,&local_7c0,0x24,uVar52,(int)local_850,iVar15,
                                 iVar26,(int)local_7f8 <= local_8ec + iVar15);
                      piVar40 = (int *)CONCAT44(local_700.refcount._4_4_,local_700.refcount._0_4_);
                      if (piVar40 != (int *)0x0) {
                        LOCK();
                        *piVar40 = *piVar40 + -1;
                        UNLOCK();
                        if (*piVar40 == 0) {
                          if (local_700.allocator == (Allocator *)0x0) {
                            if (local_700.data != (void *)0x0) {
                              free(local_700.data);
                            }
                          }
                          else {
                            (*(local_700.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_700.cstep = 0;
                      local_700.data = (void *)0x0;
                      local_700.refcount._0_4_ = 0;
                      local_700.refcount._4_4_ = 0;
                      local_700.elemsize = 0;
                      local_700.elempack = 0;
                      local_700.dims = 0;
                      local_700.w = 0;
                      local_700.h = 0;
                      local_700.d = 0;
                      local_700.c = 0;
                      piVar40 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
                      auVar61 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
                      if (piVar40 != (int *)0x0) {
                        LOCK();
                        *piVar40 = *piVar40 + -1;
                        UNLOCK();
                        if (*piVar40 == 0) {
                          if (local_680.allocator == (Allocator *)0x0) {
                            if (local_680.data != (void *)0x0) {
                              free(local_680.data);
                              auVar61 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
                            }
                          }
                          else {
                            (*(local_680.allocator)->_vptr_Allocator[3])();
                            auVar61 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
                          }
                        }
                      }
                      local_680.cstep = 0;
                      local_680.data = (void *)0x0;
                      local_680.refcount._0_4_ = 0;
                      local_680.refcount._4_4_ = 0;
                      local_680.elemsize._0_4_ = 0;
                      local_680.elemsize._4_4_ = 0;
                      local_680.elempack = 0;
                      local_680.dims = 0;
                      local_680.w = 0;
                      local_680.h = 0;
                      local_680.d = 0;
                      local_680.c = 0;
                      iVar15 = iVar15 + local_8ec;
                    } while (iVar15 < (int)local_7f8);
                  }
                  iVar15 = local_8a0->w;
                  iVar26 = local_8a0->elempack;
                  iVar16 = (int)local_8a0->cstep * iVar26;
                  local_8a4 = iVar15 + 6;
                  if (-1 < iVar15 + 3) {
                    local_8a4 = iVar15 + 3;
                  }
                  iVar50 = local_8a0->h;
                  local_858 = (Mat *)CONCAT44(local_858._4_4_,iVar50);
                  local_8a4 = local_8a4 >> 2;
                  uVar21 = 0;
                  local_7e8 = (void *)CONCAT44(local_7e8._4_4_,iVar16);
                  iVar17 = (int)local_850;
                  iVar51 = (int)local_7f0;
                  iVar42 = (int)local_860;
                  if (0xf < (int)uVar52) {
                    local_878 = (undefined1 *)(long)(iVar17 * 0x60);
                    lVar35 = (long)iVar16;
                    lVar19 = (long)(iVar16 * 2);
                    lVar20 = (long)(iVar16 * 3);
                    auVar62 = vpbroadcastd_avx512f();
                    auVar62 = vpmulld_avx512f(auVar62,_DAT_005f21c0);
                    local_8b8 = local_850 & 0xffffffff;
                    local_880 = (int *)CONCAT44(local_880._4_4_,iVar17 * 0x240);
                    local_8c8 = (long)local_878 * 4;
                    local_888 = (void *)((long)(iVar17 * 0x10) * 4);
                    local_890 = (void *)((long)(iVar17 * 0x20) * 4);
                    local_898 = (long)(iVar17 * 0x30) * 4;
                    local_7e0 = (long)(iVar17 * 0x40) * 4;
                    local_720 = (long)(iVar17 * 0x50) * 4;
                    local_8e8 = 0;
                    local_8e0 = 0;
                    do {
                      if (0 < iVar17) {
                        local_8b0 = (int *)(long)(int)local_8e8;
                        local_868 = (long)local_8b0 * 4;
                        lVar30 = local_898 + (long)local_8b0 * 4;
                        lVar55 = local_7e0 + (long)local_8b0 * 4;
                        lVar29 = local_720 + (long)local_8b0 * 4;
                        local_870 = (ulong)((iVar51 + (int)local_8e0) / iVar26);
                        uVar21 = 0;
                        pOVar13 = (Option *)0x0;
                        do {
                          local_8d8 = pOVar13;
                          local_8c0 = uVar21;
                          iVar18 = iVar42 + (int)local_8c0;
                          lVar27 = -0x140;
                          lVar45 = (long)local_7c0.data + (long)local_8d8;
                          do {
                            lVar25 = lVar45;
                            auVar63 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                         ((long)local_888 +
                                                         lVar25 + (long)local_8b0 * 4));
                            auVar64 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                         ((long)local_890 +
                                                         lVar25 + (long)local_8b0 * 4));
                            auVar65 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar25 + lVar30));
                            auVar66 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar25 + lVar55));
                            auVar67 = vpaddd_avx512f(auVar64,auVar63);
                            auVar68 = vpaddd_avx512f(auVar66,auVar65);
                            auVar63 = vpsubd_avx512f(auVar63,auVar64);
                            auVar64 = vpsubd_avx512f(auVar65,auVar66);
                            auVar65 = vpaddd_avx512f(auVar67,*(undefined1 (*) [64])
                                                              (lVar25 + local_868));
                            auVar65 = vpaddd_avx512f(auVar65,auVar68);
                            auVar66 = vpaddd_avx512f(auVar64,auVar64);
                            auVar66 = vpaddd_avx512f(auVar66,auVar63);
                            auVar68 = vpslld_avx512f(auVar68,2);
                            auVar67 = vpaddd_avx512f(auVar68,auVar67);
                            auVar64 = vpslld_avx512f(auVar64,3);
                            auVar68 = vpslld_avx512f(*(undefined1 (*) [64])(lVar25 + lVar29),2);
                            auVar63 = vpaddd_avx512f(auVar63,auVar68);
                            auVar64 = vpaddd_avx512f(auVar64,auVar63);
                            auVar63 = vmovdqa64_avx512f(auVar65);
                            *(undefined1 (*) [64])(local_540 + lVar27) = auVar63;
                            auVar63 = vmovdqa64_avx512f(auVar66);
                            *(undefined1 (*) [64])(local_3c0 + lVar27) = auVar63;
                            auVar63 = vmovdqa64_avx512f(auVar67);
                            *(undefined1 (*) [64])(local_240[0] + lVar27) = auVar63;
                            auVar63 = vmovdqa64_avx512f(auVar64);
                            *(undefined1 (*) [64])(local_c0[0] + lVar27) = auVar63;
                            lVar27 = lVar27 + 0x40;
                            lVar45 = lVar25 + local_8c8;
                          } while (lVar27 != 0);
                          iVar23 = iVar18 % local_8a4;
                          auVar63 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                       ((long)local_888 +
                                                       (long)local_878 * 4 +
                                                       lVar25 + (long)local_8b0 * 4));
                          auVar64 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                       ((long)local_890 +
                                                       (long)local_878 * 4 +
                                                       lVar25 + (long)local_8b0 * 4));
                          auVar65 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                       (lVar25 + lVar30 + (long)local_878 * 4));
                          auVar66 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                       (lVar25 + lVar55 + (long)local_878 * 4));
                          auVar67 = vpaddd_avx512f(auVar64,auVar63);
                          auVar68 = vpaddd_avx512f(auVar66,auVar65);
                          auVar63 = vpsubd_avx512f(auVar63,auVar64);
                          auVar64 = vpsubd_avx512f(auVar65,auVar66);
                          auVar65 = vpaddd_avx512f(auVar67,*(undefined1 (*) [64])
                                                            (lVar25 + local_8c8 +
                                                            (long)local_8b0 * 4));
                          auVar65 = vpaddd_avx512f(auVar65,auVar68);
                          auVar65 = vpslld_avx512f(auVar65,2);
                          auVar66 = vpslld_avx512f(auVar64,3);
                          auVar63 = vpslld_avx512f(auVar63,2);
                          auVar66 = vpaddd_avx512f(auVar66,auVar63);
                          auVar68 = vpslld_avx512f(auVar68,4);
                          auVar67 = vpslld_avx512f(auVar67,2);
                          auVar67 = vpaddd_avx512f(auVar68,auVar67);
                          auVar68 = vpslld_avx512f(*(undefined1 (*) [64])
                                                    (lVar25 + lVar29 + (long)local_878 * 4),4);
                          auVar64 = vpslld_avx512f(auVar64,5);
                          auVar63 = vpaddd_avx512f(auVar64,auVar63);
                          auVar63 = vpaddd_avx512f(auVar63,auVar68);
                          _local_540 = vmovdqa64_avx512f(auVar65);
                          local_3c0._0_64_ = vmovdqa64_avx512f(auVar66);
                          local_240[0] = vmovdqa64_avx512f(auVar67);
                          local_c0[0] = vmovdqa64_avx512f(auVar63);
                          uVar31 = iVar18 / local_8a4 << 2;
                          pauVar47 = (undefined1 (*) [64])
                                     ((long)local_8a0->data +
                                     (long)(iVar23 * 4 * iVar26) * 4 +
                                     (long)local_8a0->w * local_8a0->elemsize * (long)(int)uVar31 +
                                     local_8a0->cstep * local_870 * local_8a0->elemsize);
                          iVar54 = iVar23 * 4 + 1;
                          iVar48 = iVar23 * 4 + 2;
                          iVar18 = iVar23 * 4 + 3;
                          pauVar36 = (undefined1 (*) [64])local_540;
                          lVar45 = 0;
                          do {
                            if ((int)(uVar31 | (uint)lVar45) < iVar50) {
                              auVar63 = vmovdqa64_avx512f(pauVar36[-4]);
                              auVar64 = vmovdqa64_avx512f(pauVar36[-3]);
                              auVar65 = vmovdqa64_avx512f(pauVar36[-2]);
                              auVar66 = vmovdqa64_avx512f(pauVar36[-1]);
                              auVar67 = vpaddd_avx512f(auVar64,auVar63);
                              auVar68 = vpaddd_avx512f(auVar66,auVar65);
                              auVar63 = vpsubd_avx512f(auVar63,auVar64);
                              auVar64 = vpsubd_avx512f(auVar65,auVar66);
                              auVar65 = vpaddd_avx512f(auVar67,pauVar36[-5]);
                              auVar65 = vpaddd_avx512f(auVar65,auVar68);
                              auVar66 = vpaddd_avx512f(auVar64,auVar64);
                              auVar66 = vpaddd_avx512f(auVar66,auVar63);
                              auVar68 = vpslld_avx512f(auVar68,2);
                              auVar67 = vpaddd_avx512f(auVar68,auVar67);
                              auVar64 = vpslld_avx512f(auVar64,3);
                              auVar63 = vpaddd_avx512f(auVar63,*pauVar36);
                              auVar63 = vpaddd_avx512f(auVar63,auVar64);
                              auVar64 = vcvtdq2ps_avx512f(auVar65);
                              auVar64 = vmulps_avx512f(auVar64,auVar61);
                              auVar64 = vcvttps2dq_avx512f(auVar64);
                              auVar65 = vcvtdq2ps_avx512f(auVar66);
                              auVar65 = vmulps_avx512f(auVar65,auVar61);
                              auVar65 = vcvttps2dq_avx512f(auVar65);
                              auVar66 = vcvtdq2ps_avx512f(auVar67);
                              auVar66 = vmulps_avx512f(auVar66,auVar61);
                              auVar66 = vcvttps2dq_avx512f(auVar66);
                              auVar63 = vcvtdq2ps_avx512f(auVar63);
                              auVar63 = vmulps_avx512f(auVar63,auVar61);
                              auVar63 = vcvttps2dq_avx512f(auVar63);
                              if (iVar26 < 8) {
LAB_001a9894:
                                if (iVar26 == 1) {
                                  vpscatterdd_avx512f(ZEXT864(pauVar47) +
                                                      auVar62 * (undefined1  [64])0x4,0xffff,auVar64
                                                     );
                                  if (iVar54 < iVar15) {
                                    vpscatterdd_avx512f(ZEXT864(pauVar47) + ZEXT864(4) +
                                                        auVar62 * (undefined1  [64])0x4,0xffff,
                                                        auVar65);
                                  }
                                  if (iVar48 < iVar15) {
                                    vpscatterdd_avx512f(ZEXT864(pauVar47) + ZEXT864(8) +
                                                        auVar62 * (undefined1  [64])0x4,0xffff,
                                                        auVar66);
                                  }
                                  if (iVar18 < iVar15) {
                                    vpscatterdd_avx512f(ZEXT864(pauVar47) + ZEXT864(0xc) +
                                                        auVar62 * (undefined1  [64])0x4,0xffff,
                                                        auVar63);
                                  }
                                }
                                else if (iVar26 == 4) {
                                  *(undefined1 (*) [16])*pauVar47 = auVar64._0_16_;
                                  auVar57 = vextracti32x4_avx512f(auVar64,1);
                                  *(undefined1 (*) [16])(*pauVar47 + lVar35 * 4) = auVar57;
                                  auVar57 = vextracti32x4_avx512f(auVar64,2);
                                  *(undefined1 (*) [16])(*pauVar47 + lVar19 * 4) = auVar57;
                                  auVar57 = vextracti32x4_avx512f(auVar64,3);
                                  *(undefined1 (*) [16])(*pauVar47 + lVar20 * 4) = auVar57;
                                  if (iVar54 < iVar15) {
                                    *(undefined1 (*) [16])(*pauVar47 + 0x10) = auVar65._0_16_;
                                    auVar57 = vextracti32x4_avx512f(auVar65,1);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar35 * 4 + 8) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar65,2);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar19 * 4 + 8) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar65,3);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar20 * 4 + 8) = auVar57;
                                  }
                                  if (iVar48 < iVar15) {
                                    *(undefined1 (*) [16])(*pauVar47 + 0x20) = auVar66._0_16_;
                                    auVar57 = vextracti32x4_avx512f(auVar66,1);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar35 * 4 + 0x10) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar66,2);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar19 * 4 + 0x10) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar66,3);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar20 * 4 + 0x10) = auVar57;
                                  }
                                  if (iVar18 < iVar15) {
                                    *(undefined1 (*) [16])(*pauVar47 + 0x30) = auVar63._0_16_;
                                    auVar57 = vextracti32x4_avx512f(auVar63,1);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar35 * 4 + 0x18) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar63,2);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar19 * 4 + 0x18) = auVar57;
                                    auVar57 = vextracti32x4_avx512f(auVar63,3);
                                    *(undefined1 (*) [16])(*pauVar47 + lVar20 * 4 + 0x18) = auVar57;
                                  }
                                }
                              }
                              else {
                                if (iVar26 == 8) {
                                  *(undefined1 (*) [32])*pauVar47 = auVar64._0_32_;
                                  auVar59 = vextracti64x4_avx512f(auVar64,1);
                                  *(undefined1 (*) [32])(*pauVar47 + lVar35 * 4) = auVar59;
                                  if (iVar54 < iVar15) {
                                    *(undefined1 (*) [32])(*pauVar47 + 0x20) = auVar65._0_32_;
                                    auVar59 = vextracti64x4_avx512f(auVar65,1);
                                    *(undefined1 (*) [32])(*pauVar47 + lVar35 * 4 + 0x10) = auVar59;
                                  }
                                  if (iVar48 < iVar15) {
                                    *(undefined1 (*) [32])pauVar47[1] = auVar66._0_32_;
                                    auVar59 = vextracti64x4_avx512f(auVar66,1);
                                    *(undefined1 (*) [32])(*pauVar47 + lVar35 * 4 + 0x20) = auVar59;
                                  }
                                  if (iVar18 < iVar15) {
                                    *(undefined1 (*) [32])(pauVar47[1] + 0x20) = auVar63._0_32_;
                                    auVar59 = vextracti64x4_avx512f(auVar63,1);
                                    *(undefined1 (*) [32])(*pauVar47 + lVar35 * 4 + 0x30) = auVar59;
                                  }
                                  goto LAB_001a9894;
                                }
                                if (iVar26 == 0x10) {
                                  auVar64 = vmovdqa64_avx512f(auVar64);
                                  *pauVar47 = auVar64;
                                  if (iVar54 < iVar15) {
                                    auVar64 = vmovdqa64_avx512f(auVar65);
                                    pauVar47[1] = auVar64;
                                  }
                                  if (iVar48 < iVar15) {
                                    auVar64 = vmovdqa64_avx512f(auVar66);
                                    pauVar47[2] = auVar64;
                                  }
                                  if (iVar18 < iVar15) {
                                    auVar63 = vmovdqa64_avx512f(auVar63);
                                    pauVar47[3] = auVar63;
                                  }
                                }
                              }
                              pauVar47 = (undefined1 (*) [64])
                                         (*pauVar47 + (long)(iVar26 * iVar15) * 4);
                            }
                            lVar45 = lVar45 + 1;
                            pauVar36 = pauVar36 + 6;
                          } while (lVar45 != 4);
                          uVar21 = local_8c0 + 1;
                          pOVar13 = local_8d8 + 1;
                        } while (local_8c0 + 1 != local_8b8);
                      }
                      uVar21 = local_8e0 + 0x10;
                      uVar28 = local_8e0 + 0x1f;
                      local_8e8 = (ulong)(uint)((int)local_8e8 + iVar17 * 0x240);
                      local_8e0 = uVar21;
                    } while (uVar28 < local_690);
                  }
                  uVar31 = (uint)uVar21;
                  if ((int)(uVar31 | 7) < (int)uVar52) {
                    local_870 = (ulong)(iVar17 * 0x30);
                    lVar19 = (long)iVar16;
                    auVar59 = vpbroadcastd_avx512vl();
                    auVar59 = vpmulld_avx2(auVar59,_DAT_005f2fc0);
                    local_878 = (undefined1 *)(local_850 & 0xffffffff);
                    local_8e8 = CONCAT44(local_8e8._4_4_,uVar31 * iVar17 * 0x24);
                    local_8e0 = CONCAT44(local_8e0._4_4_,iVar17 * 0x120);
                    local_8b8 = local_870 * 4;
                    local_880 = (int *)((long)(iVar17 * 8) * 4);
                    local_888 = (void *)((long)(iVar17 * 0x10) * 4);
                    local_890 = (void *)((long)(iVar17 * 0x18) * 4);
                    local_898 = (long)(iVar17 * 0x20) * 4;
                    local_7e0 = (long)(iVar17 * 0x28) * 4;
                    local_8c8 = (long)(int)uVar31;
                    do {
                      if (0 < iVar17) {
                        local_8b0 = (int *)(long)(int)local_8e8;
                        lVar20 = local_898 + (long)local_8b0 * 4;
                        lVar35 = local_7e0 + (long)local_8b0 * 4;
                        local_868 = (ulong)((iVar51 + (int)local_8c8) / iVar26);
                        lVar30 = 0;
                        pOVar13 = (Option *)0x0;
                        do {
                          local_8d8 = pOVar13;
                          iVar18 = iVar42 + (int)local_8d8;
                          lVar29 = -0xa0;
                          lVar55 = (long)local_7c0.data + lVar30;
                          do {
                            lVar45 = lVar55;
                            auVar77 = *(undefined1 (*) [32])
                                       ((long)local_880 + lVar45 + (long)local_8b0 * 4);
                            auVar71 = *(undefined1 (*) [32])
                                       ((long)local_888 + lVar45 + (long)local_8b0 * 4);
                            auVar80 = *(undefined1 (*) [32])
                                       ((long)local_890 + lVar45 + (long)local_8b0 * 4);
                            auVar60 = *(undefined1 (*) [32])(lVar45 + lVar20);
                            auVar74 = vpaddd_avx2(auVar71,auVar77);
                            auVar81 = vpaddd_avx2(auVar60,auVar80);
                            auVar11 = vpsubd_avx2(auVar77,auVar71);
                            auVar60 = vpsubd_avx2(auVar80,auVar60);
                            auVar77 = vpaddd_avx2(auVar74,*(undefined1 (*) [32])
                                                           (lVar45 + (long)local_8b0 * 4));
                            auVar77 = vpaddd_avx2(auVar77,auVar81);
                            auVar71 = vpaddd_avx2(auVar60,auVar60);
                            auVar71 = vpaddd_avx2(auVar71,auVar11);
                            auVar80 = vpslld_avx2(auVar81,2);
                            auVar80 = vpaddd_avx2(auVar80,auVar74);
                            auVar74 = vpslld_avx2(auVar60,3);
                            auVar60 = vpslld_avx512vl(*(undefined1 (*) [32])(lVar45 + lVar35),2);
                            auVar60 = vpaddd_avx2(auVar11,auVar60);
                            auVar60 = vpaddd_avx2(auVar74,auVar60);
                            *(undefined1 (*) [32])(auStack_5e0 + lVar29) = auVar77;
                            *(undefined1 (*) [32])(local_540 + lVar29 + 0x20) = auVar71;
                            *(undefined1 (*) [32])(local_460[0] + lVar29) = auVar80;
                            *(undefined1 (*) [32])(local_3c0 + lVar29 + 0x20) = auVar60;
                            lVar29 = lVar29 + 0x20;
                            lVar55 = lVar45 + local_8b8;
                          } while (lVar29 != 0);
                          uVar21 = (long)iVar18 % (long)local_8a4;
                          local_8c0 = uVar21 & 0xffffffff;
                          auVar77 = *(undefined1 (*) [32])
                                     ((long)local_880 + local_870 * 4 + lVar45 + (long)local_8b0 * 4
                                     );
                          auVar71 = *(undefined1 (*) [32])
                                     ((long)local_888 + local_870 * 4 + lVar45 + (long)local_8b0 * 4
                                     );
                          auVar80 = *(undefined1 (*) [32])
                                     ((long)local_890 + local_870 * 4 + lVar45 + (long)local_8b0 * 4
                                     );
                          auVar60 = *(undefined1 (*) [32])(lVar45 + lVar20 + local_870 * 4);
                          auVar74 = vpaddd_avx2(auVar71,auVar77);
                          auVar81 = vpaddd_avx2(auVar60,auVar80);
                          auVar71 = vpsubd_avx2(auVar77,auVar71);
                          auVar80 = vpsubd_avx2(auVar80,auVar60);
                          auVar77 = vpaddd_avx2(auVar74,*(undefined1 (*) [32])
                                                         (lVar45 + local_8b8 + (long)local_8b0 * 4))
                          ;
                          auVar77 = vpaddd_avx2(auVar77,auVar81);
                          _auStack_5e0 = vpslld_avx2(auVar77,2);
                          auVar77 = vpslld_avx2(auVar80,3);
                          auVar71 = vpslld_avx2(auVar71,2);
                          auVar77 = vpaddd_avx2(auVar77,auVar71);
                          auVar81 = vpslld_avx2(auVar81,4);
                          auVar60 = vpslld_avx2(auVar74,2);
                          local_460[0] = vpaddd_avx2(auVar81,auVar60);
                          auVar60 = vpslld_avx512vl(*(undefined1 (*) [32])
                                                     (lVar45 + lVar35 + local_870 * 4),4);
                          auVar80 = vpslld_avx2(auVar80,5);
                          auVar71 = vpaddd_avx2(auVar80,auVar71);
                          auVar71 = vpaddd_avx2(auVar71,auVar60);
                          stack0xfffffffffffffae0 = auVar77;
                          local_3c0._32_32_ = auVar71;
                          uVar31 = iVar18 / local_8a4 << 2;
                          iVar18 = (int)uVar21;
                          pauVar37 = (undefined1 (*) [32])
                                     ((long)local_8a0->data +
                                     (long)(iVar18 * 4 * iVar26) * 4 +
                                     (long)local_8a0->w * local_8a0->elemsize * (long)(int)uVar31 +
                                     local_8a0->cstep * local_868 * local_8a0->elemsize);
                          iVar23 = iVar18 * 4 + 1;
                          iVar48 = iVar18 * 4 + 2;
                          iVar18 = iVar18 * 4 + 3;
                          pauVar49 = (undefined1 (*) [32])auStack_5e0;
                          lVar55 = 0;
                          do {
                            if ((int)(uVar31 | (uint)lVar55) < iVar50) {
                              auVar77 = vpaddd_avx2(pauVar49[-3],pauVar49[-4]);
                              auVar71 = vpaddd_avx2(pauVar49[-1],pauVar49[-2]);
                              auVar74 = vpsubd_avx2(pauVar49[-4],pauVar49[-3]);
                              auVar81 = vpsubd_avx2(pauVar49[-2],pauVar49[-1]);
                              auVar80 = vpaddd_avx2(auVar77,pauVar49[-5]);
                              auVar80 = vpaddd_avx2(auVar80,auVar71);
                              auVar60 = vpaddd_avx2(auVar81,auVar81);
                              auVar60 = vpaddd_avx2(auVar60,auVar74);
                              auVar71 = vpslld_avx2(auVar71,2);
                              auVar71 = vpaddd_avx2(auVar71,auVar77);
                              auVar81 = vpslld_avx2(auVar81,3);
                              auVar77 = vpaddd_avx2(auVar74,*pauVar49);
                              auVar74 = vpaddd_avx2(auVar77,auVar81);
                              auVar77 = vcvtdq2ps_avx(auVar80);
                              auVar72._0_4_ = (int)(auVar77._0_4_ * 0.0017361111);
                              auVar72._4_4_ = (int)(auVar77._4_4_ * 0.0017361111);
                              auVar72._8_4_ = (int)(auVar77._8_4_ * 0.0017361111);
                              auVar72._12_4_ = (int)(auVar77._12_4_ * 0.0017361111);
                              auVar81._16_4_ = (int)(auVar77._16_4_ * 0.0017361111);
                              auVar81._0_16_ = auVar72;
                              auVar81._20_4_ = (int)(auVar77._20_4_ * 0.0017361111);
                              auVar81._24_4_ = (int)(auVar77._24_4_ * 0.0017361111);
                              auVar81._28_4_ = (int)auVar77._28_4_;
                              auVar77 = vcvtdq2ps_avx(auVar60);
                              auVar58._0_4_ = (int)(auVar77._0_4_ * 0.0017361111);
                              auVar58._4_4_ = (int)(auVar77._4_4_ * 0.0017361111);
                              auVar58._8_4_ = (int)(auVar77._8_4_ * 0.0017361111);
                              auVar58._12_4_ = (int)(auVar77._12_4_ * 0.0017361111);
                              auVar60._16_4_ = (int)(auVar77._16_4_ * 0.0017361111);
                              auVar60._0_16_ = auVar58;
                              auVar60._20_4_ = (int)(auVar77._20_4_ * 0.0017361111);
                              auVar60._24_4_ = (int)(auVar77._24_4_ * 0.0017361111);
                              auVar60._28_4_ = (int)auVar77._28_4_;
                              auVar77 = vcvtdq2ps_avx(auVar71);
                              auVar78._0_4_ = (int)(auVar77._0_4_ * 0.0017361111);
                              auVar78._4_4_ = (int)(auVar77._4_4_ * 0.0017361111);
                              auVar78._8_4_ = (int)(auVar77._8_4_ * 0.0017361111);
                              auVar78._12_4_ = (int)(auVar77._12_4_ * 0.0017361111);
                              auVar80._16_4_ = (int)(auVar77._16_4_ * 0.0017361111);
                              auVar80._0_16_ = auVar78;
                              auVar80._20_4_ = (int)(auVar77._20_4_ * 0.0017361111);
                              auVar80._24_4_ = (int)(auVar77._24_4_ * 0.0017361111);
                              auVar80._28_4_ = (int)auVar77._28_4_;
                              auVar77 = vcvtdq2ps_avx(auVar74);
                              auVar70._0_4_ = (int)(auVar77._0_4_ * 0.0017361111);
                              auVar70._4_4_ = (int)(auVar77._4_4_ * 0.0017361111);
                              auVar70._8_4_ = (int)(auVar77._8_4_ * 0.0017361111);
                              auVar70._12_4_ = (int)(auVar77._12_4_ * 0.0017361111);
                              auVar71._16_4_ = (int)(auVar77._16_4_ * 0.0017361111);
                              auVar71._0_16_ = auVar70;
                              auVar71._20_4_ = (int)(auVar77._20_4_ * 0.0017361111);
                              auVar71._24_4_ = (int)(auVar77._24_4_ * 0.0017361111);
                              auVar71._28_4_ = (int)auVar77._28_4_;
                              if (iVar26 == 1) {
                                vpscatterdd_avx512vl
                                          (ZEXT832(pauVar37) + auVar59 * (undefined1  [32])0x4,
                                           0xffff,auVar81);
                                if (iVar23 < iVar15) {
                                  vpscatterdd_avx512vl
                                            (ZEXT832(pauVar37) + ZEXT832(4) +
                                             auVar59 * (undefined1  [32])0x4,0xffff,auVar60);
                                }
                                if (iVar48 < iVar15) {
                                  vpscatterdd_avx512vl
                                            (ZEXT832(pauVar37) + ZEXT832(8) +
                                             auVar59 * (undefined1  [32])0x4,0xffff,auVar80);
                                }
                                if (iVar18 < iVar15) {
                                  vpscatterdd_avx512vl
                                            (ZEXT832(pauVar37) + ZEXT832(0xc) +
                                             auVar59 * (undefined1  [32])0x4,0xffff,auVar71);
                                }
                              }
                              else if (iVar26 == 4) {
                                *(undefined1 (*) [16])*pauVar37 = auVar72;
                                *(undefined1 (*) [16])(*pauVar37 + lVar19 * 4) = auVar81._16_16_;
                                if (iVar23 < iVar15) {
                                  *(undefined1 (*) [16])(*pauVar37 + 0x10) = auVar58;
                                  *(undefined1 (*) [16])(*pauVar37 + lVar19 * 4 + 0x10) =
                                       auVar60._16_16_;
                                }
                                if (iVar48 < iVar15) {
                                  *(undefined1 (*) [16])pauVar37[1] = auVar78;
                                  *(undefined1 (*) [16])(pauVar37[1] + lVar19 * 4) = auVar80._16_16_
                                  ;
                                }
                                if (iVar18 < iVar15) {
                                  *(undefined1 (*) [16])(pauVar37[1] + 0x10) = auVar70;
                                  *(undefined1 (*) [16])(pauVar37[1] + lVar19 * 4 + 0x10) =
                                       auVar71._16_16_;
                                }
                              }
                              else if (iVar26 == 8) {
                                *pauVar37 = auVar81;
                                if (iVar23 < iVar15) {
                                  pauVar37[1] = auVar60;
                                }
                                if (iVar48 < iVar15) {
                                  pauVar37[2] = auVar80;
                                }
                                if (iVar18 < iVar15) {
                                  pauVar37[3] = auVar71;
                                }
                              }
                              pauVar37 = (undefined1 (*) [32])
                                         (*pauVar37 + (long)(iVar26 * iVar15) * 4);
                            }
                            lVar55 = lVar55 + 1;
                            pauVar49 = pauVar49 + 6;
                          } while (lVar55 != 4);
                          lVar30 = lVar30 + 0x20;
                          pOVar13 = (Option *)&local_8d8->use_shader_pack8;
                        } while (&local_8d8->use_shader_pack8 != (bool *)local_878);
                      }
                      uVar21 = local_8c8 + 8;
                      lVar20 = local_8c8 + 0xf;
                      local_8e8 = CONCAT44(local_8e8._4_4_,(int)local_8e8 + iVar17 * 0x120);
                      local_8c8 = uVar21;
                    } while (lVar20 < (long)local_7c8);
                  }
                  uVar22 = iVar17 * 4;
                  local_710 = (ulong)uVar22;
                  uVar31 = (uint)uVar21;
                  if ((int)(uVar31 | 3) < (int)uVar52) {
                    local_870 = (ulong)(iVar17 * 0x18);
                    auVar57 = vpbroadcastd_avx512vl();
                    auVar57 = vpmulld_avx(auVar57,_DAT_005f1590);
                    local_878 = (undefined1 *)(local_850 & 0xffffffff);
                    local_8c8 = CONCAT44(local_8c8._4_4_,uVar31 * iVar17 * 0x24);
                    local_8e8 = CONCAT44(local_8e8._4_4_,iVar17 * 0x90);
                    local_8e0 = (long)(int)uVar22 * 4;
                    local_880 = (int *)((long)(iVar17 * 8) * 4);
                    local_888 = (void *)((long)(iVar17 * 0xc) * 4);
                    local_890 = (void *)((long)(iVar17 * 0x10) * 4);
                    local_898 = (long)(iVar17 * 0x14) * 4;
                    local_8b8 = (long)(int)uVar31;
                    do {
                      if (0 < iVar17) {
                        local_8b0 = (int *)(long)(int)local_8c8;
                        lVar19 = local_8e0 + (long)local_8b0 * 4;
                        lVar20 = local_898 + (long)local_8b0 * 4;
                        local_868 = (ulong)((iVar51 + (int)local_8b8) / iVar26);
                        lVar35 = 0;
                        pOVar13 = (Option *)0x0;
                        do {
                          local_8d8 = pOVar13;
                          iVar18 = iVar42 + (int)local_8d8;
                          lVar55 = -0x50;
                          lVar30 = (long)local_7c0.data + lVar35;
                          do {
                            lVar29 = lVar30;
                            auVar69 = *(undefined1 (*) [16])(lVar29 + lVar19);
                            auVar70 = *(undefined1 (*) [16])
                                       ((long)local_880 + lVar29 + (long)local_8b0 * 4);
                            auVar78 = *(undefined1 (*) [16])
                                       ((long)local_888 + lVar29 + (long)local_8b0 * 4);
                            auVar58 = *(undefined1 (*) [16])
                                       ((long)local_890 + lVar29 + (long)local_8b0 * 4);
                            auVar72 = vpaddd_avx(auVar70,auVar69);
                            auVar79 = vpaddd_avx(auVar58,auVar78);
                            auVar73 = vpsubd_avx(auVar69,auVar70);
                            auVar58 = vpsubd_avx(auVar78,auVar58);
                            auVar69 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                                          (lVar29 + (long)local_8b0 * 4));
                            auVar69 = vpaddd_avx(auVar69,auVar79);
                            auVar70 = vpaddd_avx(auVar58,auVar58);
                            auVar70 = vpaddd_avx(auVar70,auVar73);
                            auVar78 = vpslld_avx(auVar79,2);
                            auVar78 = vpaddd_avx(auVar78,auVar72);
                            auVar72 = vpslld_avx(auVar58,3);
                            auVar58 = vpslld_avx512vl(*(undefined1 (*) [16])(lVar29 + lVar20),2);
                            auVar58 = vpaddd_avx(auVar73,auVar58);
                            auVar58 = vpaddd_avx(auVar72,auVar58);
                            *(undefined1 (*) [16])(auStack_630 + lVar55) = auVar69;
                            *(undefined1 (*) [16])(auStack_5e0 + lVar55 + 0x10) = auVar70;
                            *(undefined1 (*) [16])(aauStack_570[0] + lVar55) = auVar78;
                            *(undefined1 (*) [16])(aauStack_510[0] + lVar55) = auVar58;
                            lVar30 = lVar29 + local_870 * 4;
                            lVar55 = lVar55 + 0x10;
                          } while (lVar55 != 0);
                          uVar21 = (long)iVar18 % (long)local_8a4;
                          local_8c0 = uVar21 & 0xffffffff;
                          auVar69 = *(undefined1 (*) [16])(lVar29 + lVar19 + local_870 * 4);
                          auVar70 = *(undefined1 (*) [16])
                                     ((long)local_880 + local_870 * 4 + lVar29 + (long)local_8b0 * 4
                                     );
                          auVar78 = *(undefined1 (*) [16])
                                     ((long)local_888 + local_870 * 4 + lVar29 + (long)local_8b0 * 4
                                     );
                          auVar58 = *(undefined1 (*) [16])
                                     ((long)local_890 + local_870 * 4 + lVar29 + (long)local_8b0 * 4
                                     );
                          auVar72 = vpaddd_avx(auVar70,auVar69);
                          auVar79 = vpaddd_avx(auVar58,auVar78);
                          auVar70 = vpsubd_avx(auVar69,auVar70);
                          auVar78 = vpsubd_avx(auVar78,auVar58);
                          auVar69 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                                        (lVar30 + (long)local_8b0 * 4));
                          auVar69 = vpaddd_avx(auVar69,auVar79);
                          auStack_630 = vpslld_avx(auVar69,2);
                          auVar69 = vpslld_avx(auVar78,3);
                          auVar70 = vpslld_avx(auVar70,2);
                          auVar69 = vpaddd_avx(auVar69,auVar70);
                          auVar79 = vpslld_avx(auVar79,4);
                          auVar58 = vpslld_avx(auVar72,2);
                          aauStack_570[0] = vpaddd_avx(auVar79,auVar58);
                          auVar58 = vpslld_avx512vl(*(undefined1 (*) [16])
                                                     (lVar29 + lVar20 + local_870 * 4),4);
                          auVar78 = vpslld_avx(auVar78,5);
                          auVar70 = vpaddd_avx(auVar78,auVar70);
                          auVar70 = vpaddd_avx(auVar70,auVar58);
                          stack0xfffffffffffffa30 = auVar69;
                          aauStack_510[0] = auVar70;
                          uVar31 = iVar18 / local_8a4 << 2;
                          iVar18 = (int)uVar21;
                          pauVar38 = (undefined1 (*) [16])
                                     ((long)local_8a0->data +
                                     (long)(iVar18 * 4 * iVar26) * 4 +
                                     (long)local_8a0->w * local_8a0->elemsize * (long)(int)uVar31 +
                                     local_8a0->cstep * local_868 * local_8a0->elemsize);
                          iVar23 = iVar18 * 4 + 1;
                          iVar48 = iVar18 * 4 + 2;
                          iVar18 = iVar18 * 4 + 3;
                          pauVar53 = &auStack_630;
                          lVar30 = 0;
                          do {
                            if ((int)(uVar31 | (uint)lVar30) < iVar50) {
                              auVar69 = vpaddd_avx(pauVar53[-3],pauVar53[-4]);
                              auVar70 = vpaddd_avx(pauVar53[-1],pauVar53[-2]);
                              auVar72 = vpsubd_avx(pauVar53[-4],pauVar53[-3]);
                              auVar79 = vpsubd_avx(pauVar53[-2],pauVar53[-1]);
                              auVar78 = vpaddd_avx(auVar69,pauVar53[-5]);
                              auVar78 = vpaddd_avx(auVar78,auVar70);
                              auVar58 = vpaddd_avx(auVar79,auVar79);
                              auVar58 = vpaddd_avx(auVar58,auVar72);
                              auVar70 = vpslld_avx(auVar70,2);
                              auVar70 = vpaddd_avx(auVar70,auVar69);
                              auVar79 = vpslld_avx(auVar79,3);
                              auVar69 = vpaddd_avx(auVar72,*pauVar53);
                              auVar72 = vpaddd_avx(auVar69,auVar79);
                              auVar69 = vcvtdq2ps_avx(auVar78);
                              auVar76._0_4_ = (int)(auVar69._0_4_ * 0.0017361111);
                              auVar76._4_4_ = (int)(auVar69._4_4_ * 0.0017361111);
                              auVar76._8_4_ = (int)(auVar69._8_4_ * 0.0017361111);
                              auVar76._12_4_ = (int)(auVar69._12_4_ * 0.0017361111);
                              auVar69 = vcvtdq2ps_avx(auVar58);
                              auVar75._0_4_ = (int)(auVar69._0_4_ * 0.0017361111);
                              auVar75._4_4_ = (int)(auVar69._4_4_ * 0.0017361111);
                              auVar75._8_4_ = (int)(auVar69._8_4_ * 0.0017361111);
                              auVar75._12_4_ = (int)(auVar69._12_4_ * 0.0017361111);
                              auVar69 = vcvtdq2ps_avx(auVar70);
                              auVar73._0_4_ = (int)(auVar69._0_4_ * 0.0017361111);
                              auVar73._4_4_ = (int)(auVar69._4_4_ * 0.0017361111);
                              auVar73._8_4_ = (int)(auVar69._8_4_ * 0.0017361111);
                              auVar73._12_4_ = (int)(auVar69._12_4_ * 0.0017361111);
                              auVar69 = vcvtdq2ps_avx(auVar72);
                              auVar79._0_4_ = (int)(auVar69._0_4_ * 0.0017361111);
                              auVar79._4_4_ = (int)(auVar69._4_4_ * 0.0017361111);
                              auVar79._8_4_ = (int)(auVar69._8_4_ * 0.0017361111);
                              auVar79._12_4_ = (int)(auVar69._12_4_ * 0.0017361111);
                              if (iVar26 == 1) {
                                auVar6._8_8_ = 0;
                                auVar6._0_8_ = pauVar38;
                                vpscatterdd_avx512vl
                                          (auVar6 + auVar57 * (undefined1  [16])0x4,0xffff,auVar76);
                                if (iVar23 < iVar15) {
                                  auVar7._8_8_ = 0;
                                  auVar7._0_8_ = pauVar38;
                                  vpscatterdd_avx512vl
                                            (auVar7 + ZEXT816(4) + auVar57 * (undefined1  [16])0x4,
                                             0xffff,auVar75);
                                }
                                if (iVar48 < iVar15) {
                                  auVar8._8_8_ = 0;
                                  auVar8._0_8_ = pauVar38;
                                  vpscatterdd_avx512vl
                                            (auVar8 + ZEXT816(8) + auVar57 * (undefined1  [16])0x4,
                                             0xffff,auVar73);
                                }
                                if (iVar18 < iVar15) {
                                  auVar9._8_8_ = 0;
                                  auVar9._0_8_ = pauVar38;
                                  vpscatterdd_avx512vl
                                            (auVar9 + ZEXT816(0xc) + auVar57 * (undefined1  [16])0x4
                                             ,0xffff,auVar79);
                                }
                              }
                              else if (iVar26 == 4) {
                                *pauVar38 = auVar76;
                                if (iVar23 < iVar15) {
                                  pauVar38[1] = auVar75;
                                }
                                if (iVar48 < iVar15) {
                                  pauVar38[2] = auVar73;
                                }
                                if (iVar18 < iVar15) {
                                  pauVar38[3] = auVar79;
                                }
                              }
                              pauVar38 = (undefined1 (*) [16])
                                         (*pauVar38 + (long)(iVar26 * iVar15) * 4);
                            }
                            lVar30 = lVar30 + 1;
                            pauVar53 = pauVar53 + 6;
                          } while (lVar30 != 4);
                          lVar35 = lVar35 + 0x10;
                          pOVar13 = (Option *)&local_8d8->use_shader_pack8;
                        } while (&local_8d8->use_shader_pack8 != (bool *)local_878);
                      }
                      uVar21 = local_8b8 + 4;
                      lVar19 = local_8b8 + 7;
                      local_8c8 = CONCAT44(local_8c8._4_4_,(int)local_8c8 + iVar17 * 0x90);
                      local_8b8 = uVar21;
                    } while (lVar19 < (long)local_7c8);
                  }
                  uVar31 = (uint)uVar21;
                  if ((int)(uVar31 | 1) < (int)uVar52) {
                    local_698 = local_7c0.data;
                    lVar35 = (long)(iVar17 * 2);
                    lVar30 = (long)(iVar17 * 6);
                    lVar19 = (long)(iVar17 * 8);
                    lVar20 = (long)(iVar17 * 10);
                    local_7e0 = (long)(iVar17 * 0xc);
                    local_720 = local_8a0->elemsize;
                    local_6a0 = local_8a0->cstep * local_720;
                    local_8e0 = (ulong)iVar16;
                    local_7d4 = uVar31 * iVar17 * 0x24;
                    local_714 = iVar17 * 0x48;
                    local_898 = lVar35 * 4;
                    local_8d8 = (Option *)(lVar20 * 4);
                    local_6a8 = local_8a0->data;
                    local_7e8 = (void *)(local_850 & 0xffffffff);
                    local_8c0 = local_7e0 * 4;
                    local_728 = (long)(int)uVar31;
                    do {
                      if (0 < iVar17) {
                        local_890 = (void *)((local_708 + local_728) * local_6a0 + (long)local_6a8);
                        pvVar12 = (void *)0x0;
                        piVar40 = (int *)((long)local_7c0.data + (long)local_7d4 * 4);
                        do {
                          local_880 = piVar40;
                          local_888 = pvVar12;
                          iVar26 = (int)local_888 + iVar42;
                          lVar55 = -0x28;
                          piVar40 = local_880;
                          do {
                            piVar41 = piVar40;
                            iVar16 = piVar41[(int)uVar22] + piVar41[lVar35];
                            iVar51 = piVar41[(long)(int)uVar22 + 1] + piVar41[lVar35 + 1];
                            iVar34 = piVar41[lVar35] - piVar41[(int)uVar22];
                            iVar24 = piVar41[lVar35 + 1] - piVar41[(long)(int)uVar22 + 1];
                            iVar18 = piVar41[lVar19] + piVar41[lVar30];
                            iVar46 = piVar41[lVar30] - piVar41[lVar19];
                            iVar23 = piVar41[lVar19 + 1] + piVar41[lVar30 + 1];
                            iVar43 = piVar41[lVar30 + 1] - piVar41[lVar19 + 1];
                            iVar48 = piVar41[lVar20];
                            iVar54 = (piVar41 + 1)[lVar20];
                            iVar44 = piVar41[1];
                            *(int *)((long)aiStack_638 + lVar55 + -0x20) =
                                 iVar18 + iVar16 + *piVar41;
                            *(int *)((long)aiStack_638 + lVar55 + -0x1c) = iVar23 + iVar51 + iVar44;
                            *(int *)(auStack_630 + lVar55 + 8) = iVar34 + iVar46 * 2;
                            *(int *)(auStack_630 + lVar55 + 0xc) = iVar24 + iVar43 * 2;
                            *(int *)((long)aiStack_620 + lVar55 + 0x28) = iVar16 + iVar18 * 4;
                            *(int *)((long)aiStack_620 + lVar55 + 0x2c) = iVar51 + iVar23 * 4;
                            *(int *)((long)aiStack_5c8 + lVar55) = iVar34 + iVar46 * 8 + iVar48 * 4;
                            *(int *)((long)aiStack_5c8 + lVar55 + 4) =
                                 iVar24 + iVar43 * 8 + iVar54 * 4;
                            piVar40 = piVar41 + local_7e0;
                            lVar55 = lVar55 + 8;
                          } while (lVar55 != 0);
                          iVar48 = iVar26 % local_8a4;
                          iVar16 = piVar41[(int)uVar22 + local_7e0] + piVar41[lVar35 + local_7e0];
                          iVar51 = piVar41[lVar35 + local_7e0 + 1] +
                                   piVar41[(long)(int)uVar22 + local_7e0 + 1];
                          iVar24 = piVar41[lVar35 + local_7e0] - piVar41[(int)uVar22 + local_7e0];
                          iVar54 = piVar41[lVar35 + local_7e0 + 1] -
                                   piVar41[(long)(int)uVar22 + local_7e0 + 1];
                          iVar18 = piVar41[lVar19 + local_7e0] + piVar41[lVar30 + local_7e0];
                          iVar34 = piVar41[lVar30 + local_7e0] - piVar41[lVar19 + local_7e0];
                          iVar23 = piVar41[lVar19 + local_7e0 + 1] + piVar41[lVar30 + local_7e0 + 1]
                          ;
                          iVar44 = piVar41[lVar30 + local_7e0 + 1] - piVar41[lVar19 + local_7e0 + 1]
                          ;
                          local_680.dims = (iVar16 + iVar18 + *piVar40) * 4;
                          local_680.w = (iVar23 + iVar51 + piVar40[1]) * 4;
                          auStack_630._8_4_ = iVar24 * 4 + iVar34 * 8;
                          auStack_630._12_4_ = iVar54 * 4 + iVar44 * 8;
                          aiStack_620[10] = iVar18 * 0x10 + iVar16 * 4;
                          aiStack_620[0xb] = iVar23 * 0x10 + iVar51 * 4;
                          aiStack_5c8[0] =
                               iVar34 * 0x20 + iVar24 * 4 + (piVar41 + lVar20)[local_7e0] * 0x10;
                          aiStack_5c8[1] =
                               iVar44 * 0x20 + iVar54 * 4 + (piVar41 + lVar20)[local_7e0 + 1] * 0x10
                          ;
                          uVar31 = iVar26 / local_8a4 << 2;
                          iVar26 = iVar48 * 4 + 1;
                          local_8b8 = CONCAT44(local_8b8._4_4_,iVar26);
                          iVar16 = iVar48 * 4 + 2;
                          local_8c8 = CONCAT44(local_8c8._4_4_,iVar16);
                          iVar51 = iVar48 * 4 + 3;
                          local_8e8 = CONCAT44(local_8e8._4_4_,iVar51);
                          piVar40 = &local_680.w;
                          lVar55 = 0;
                          piVar41 = (int *)((long)local_890 +
                                           (long)(iVar48 * 4) * 4 +
                                           (long)local_8a0->w * local_720 * (long)(int)uVar31);
                          do {
                            piVar39 = piVar41;
                            if ((int)(uVar31 | (uint)lVar55) < iVar50) {
                              uVar1 = (int)*(size_t *)(piVar40 + -7) + piVar40[-9];
                              local_868 = (ulong)uVar1;
                              uVar2 = piVar40[-6] + piVar40[-8];
                              local_870 = (ulong)uVar2;
                              uVar3 = piVar40[-3] + piVar40[-5];
                              local_878 = (undefined1 *)(ulong)uVar3;
                              iVar18 = piVar40[-2] + piVar40[-4];
                              iVar24 = piVar40[-9] - (int)*(size_t *)(piVar40 + -7);
                              iVar34 = piVar40[-8] - piVar40[-6];
                              iVar23 = piVar40[-10];
                              iVar43 = piVar40[-5] - piVar40[-3];
                              iVar48 = piVar40[-1];
                              iVar44 = piVar40[-4] - piVar40[-2];
                              iVar54 = *piVar40;
                              *piVar41 = (int)(uVar1 + uVar3 +
                                              *(int *)&((Mat *)(piVar40 + -0xb))->data) / 0x240;
                              piVar41[local_8e0] = (int)(iVar18 + uVar2 + iVar23) / 0x240;
                              if (iVar26 < iVar15) {
                                piVar41[1] = (iVar24 + iVar43 * 2) / 0x240;
                                piVar41[local_8e0 + 1] = (iVar34 + iVar44 * 2) / 0x240;
                              }
                              if (iVar16 < iVar15) {
                                piVar41[2] = (int)(uVar1 + uVar3 * 4) / 0x240;
                                piVar41[local_8e0 + 2] = (int)(uVar2 + iVar18 * 4) / 0x240;
                              }
                              if (iVar51 < iVar15) {
                                piVar41[3] = (iVar24 + iVar43 * 8 + iVar48) / 0x240;
                                piVar41[local_8e0 + 3] = (iVar34 + iVar44 * 8 + iVar54) / 0x240;
                              }
                              piVar39 = piVar41 + iVar15;
                              local_8b0 = piVar41;
                            }
                            lVar55 = lVar55 + 1;
                            piVar40 = piVar40 + 0xc;
                            piVar41 = piVar39;
                          } while (lVar55 != 4);
                          pvVar12 = (void *)((long)local_888 + 1U);
                          piVar40 = local_880 + 2;
                        } while ((void *)((long)local_888 + 1U) != local_7e8);
                      }
                      uVar21 = local_728 + 2;
                      lVar55 = local_728 + 3;
                      local_7d4 = local_7d4 + local_714;
                      local_728 = uVar21;
                    } while (lVar55 < (long)local_7c8);
                  }
                  iVar26 = (int)uVar21;
                  if (iVar26 < (int)uVar52) {
                    local_880 = (int *)CONCAT44(local_880._4_4_,iVar17 * 0x24);
                    local_888 = local_7c0.data;
                    lVar19 = (long)iVar17;
                    lVar30 = (long)(iVar17 * 2);
                    lVar55 = (long)(iVar17 * 3);
                    lVar20 = (long)(int)uVar22;
                    lVar35 = (long)(iVar17 * 5);
                    local_878 = (undefined1 *)(long)(iVar17 * 6);
                    local_890 = local_8a0->data;
                    local_8b8 = local_8a0->elemsize;
                    local_898 = local_8a0->cstep * local_8b8;
                    local_8e8 = (ulong)iVar26;
                    local_870 = lVar35 * 4;
                    local_8e0 = CONCAT44(local_8e0._4_4_,iVar26 * iVar17 * 0x24);
                    local_868 = lVar20 * 4;
                    local_8b0 = (int *)(lVar55 * 4);
                    local_8c0 = lVar30 * 4;
                    local_8d8 = (Option *)(lVar19 * 4);
                    local_8c8 = local_850 & 0xffffffff;
                    do {
                      if (0 < iVar17) {
                        piVar40 = (int *)((long)local_7c0.data + (long)(int)local_8e0 * 4);
                        uVar21 = 0;
                        do {
                          iVar26 = (int)uVar21 + iVar42;
                          lVar29 = -0x14;
                          piVar41 = piVar40;
                          do {
                            piVar39 = piVar41;
                            iVar16 = piVar39[lVar30] + piVar39[lVar19];
                            iVar23 = piVar39[lVar19] - piVar39[lVar30];
                            iVar51 = piVar39[lVar20] + piVar39[lVar55];
                            iVar48 = piVar39[lVar55] - piVar39[lVar20];
                            iVar18 = piVar39[lVar35];
                            *(int *)((long)aiStack_638 + lVar29 + -0x34) =
                                 iVar51 + iVar16 + *piVar39;
                            *(int *)((long)aiStack_638 + lVar29 + -0x1c) = iVar23 + iVar48 * 2;
                            *(int *)((long)aiStack_638 + lVar29 + -4) = iVar16 + iVar51 * 4;
                            *(int *)(auStack_630 + lVar29 + 0xc) = iVar23 + iVar48 * 8 + iVar18 * 4;
                            lVar29 = lVar29 + 4;
                            piVar41 = piVar39 + (long)local_878;
                          } while (lVar29 != 0);
                          iVar18 = iVar26 % local_8a4;
                          iVar16 = piVar39[(long)(local_878 + lVar30)] +
                                   (piVar39 + lVar19)[(long)local_878];
                          iVar23 = (piVar39 + lVar19)[(long)local_878] -
                                   piVar39[(long)(local_878 + lVar30)];
                          iVar51 = piVar39[(long)(local_878 + lVar20)] +
                                   (piVar39 + lVar55)[(long)local_878];
                          iVar48 = (piVar39 + lVar55)[(long)local_878] -
                                   piVar39[(long)(local_878 + lVar20)];
                          local_680.elemsize._4_4_ =
                               (iVar51 + iVar16 + piVar39[(long)local_878]) * 4;
                          local_680.w = iVar23 * 4 + iVar48 * 8;
                          local_680.cstep =
                               CONCAT44(iVar51 * 0x10 + iVar16 * 4,(undefined4)local_680.cstep);
                          auStack_630._12_4_ =
                               iVar48 * 0x20 + iVar23 * 4 +
                               piVar39[(long)(local_878 + lVar35)] * 0x10;
                          uVar31 = iVar26 / local_8a4 << 2;
                          piVar41 = (int *)((long)local_890 +
                                           (long)(iVar18 * 4) * 4 +
                                           (long)local_8a0->w * local_8b8 * (long)(int)uVar31 +
                                           (local_708 + local_8e8) * local_898);
                          piVar39 = (int *)((long)&local_680.elemsize + 4);
                          lVar29 = 0;
                          do {
                            if ((int)(uVar31 | (uint)lVar29) < iVar50) {
                              iVar26 = piVar39[-3] + piVar39[-4];
                              iVar16 = piVar39[-1] + piVar39[-2];
                              iVar48 = piVar39[-4] - piVar39[-3];
                              iVar23 = piVar39[-2] - piVar39[-1];
                              iVar51 = *piVar39;
                              *piVar41 = (iVar16 + iVar26 + piVar39[-5]) / 0x240;
                              if (iVar18 * 4 + 1 < iVar15) {
                                piVar41[1] = (iVar48 + iVar23 * 2) / 0x240;
                              }
                              if (iVar18 * 4 + 2 < iVar15) {
                                piVar41[2] = (iVar26 + iVar16 * 4) / 0x240;
                              }
                              if (iVar18 * 4 + 3 < iVar15) {
                                piVar41[3] = (iVar48 + iVar23 * 8 + iVar51) / 0x240;
                              }
                              piVar41 = piVar41 + iVar15;
                            }
                            lVar29 = lVar29 + 1;
                            piVar39 = piVar39 + 6;
                          } while (lVar29 != 4);
                          uVar21 = uVar21 + 1;
                          piVar40 = piVar40 + 1;
                        } while (uVar21 != local_8c8);
                      }
                      local_8e8 = local_8e8 + 1;
                      local_8e0 = CONCAT44(local_8e0._4_4_,(int)local_8e0 + iVar17 * 0x24);
                    } while (local_8e8 != local_7c8);
                  }
                  uVar21 = (ulong)(iVar42 + local_8cc);
                } while ((int)(iVar42 + local_8cc) < (int)local_7d0);
              }
              piVar40 = (int *)CONCAT44(local_7c0.refcount._4_4_,local_7c0.refcount._0_4_);
              if (piVar40 != (int *)0x0) {
                LOCK();
                *piVar40 = *piVar40 + -1;
                UNLOCK();
                if (*piVar40 == 0) {
                  if (local_7c0.allocator == (Allocator *)0x0) {
                    if (local_7c0.data != (void *)0x0) {
                      free(local_7c0.data);
                    }
                  }
                  else {
                    (*(local_7c0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_7c0.cstep = 0;
              local_7c0.data = (void *)0x0;
              local_7c0.refcount._0_4_ = 0;
              local_7c0.refcount._4_4_ = 0;
              local_7c0.elemsize = 0;
              local_7c0.elempack = 0;
              local_7c0.dims = 0;
              local_7c0.w = 0;
              local_7c0.h = 0;
              local_7c0.d = 0;
              local_7c0.c = 0;
              local_848 = local_848 + 1;
            } while (local_848 != local_7d8);
          }
          iVar26 = 0;
        }
        piVar40 = (int *)CONCAT44(local_840.refcount._4_4_,local_840.refcount._0_4_);
        if (piVar40 != (int *)0x0) {
          LOCK();
          *piVar40 = *piVar40 + -1;
          UNLOCK();
          if (*piVar40 == 0) {
            if (local_840.allocator == (Allocator *)0x0) {
              if (local_840.data != (void *)0x0) {
                free(local_840.data);
              }
            }
            else {
              (*(local_840.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_840.cstep = 0;
        local_840.data = (void *)0x0;
        local_840.refcount._0_4_ = 0;
        local_840.refcount._4_4_ = 0;
        local_840.elemsize = 0;
        local_840.elempack = 0;
        local_840.dims = 0;
        local_840.w = 0;
        local_840.h = 0;
        local_840.d = 0;
        local_840.c = 0;
      }
      goto LAB_001ab076;
    }
    piVar40 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (local_680.allocator == (Allocator *)0x0) {
LAB_001a8dc6:
          if (local_680.data != (void *)0x0) {
            free(local_680.data);
          }
        }
        else {
          (*(local_680.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_680.cstep = 0;
  local_680.data = (void *)0x0;
  local_680.refcount._0_4_ = 0;
  local_680.refcount._4_4_ = 0;
  local_680.elemsize._0_4_ = 0;
  local_680.elemsize._4_4_ = 0;
  local_680.elempack = 0;
  local_680.dims = 0;
  local_680.w = 0;
  local_680.h = 0;
  local_680.d = 0;
  local_680.c = 0;
  iVar26 = -100;
LAB_001ab076:
  piVar40 = (int *)CONCAT44(local_770.refcount._4_4_,local_770.refcount._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      if (local_770.allocator == (Allocator *)0x0) {
        if (local_770.data != (void *)0x0) {
          free(local_770.data);
        }
      }
      else {
        (*(local_770.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

static int conv3x3s1_winograd43_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        return conv3x3s1_winograd43_int8_avx512vnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        return conv3x3s1_winograd43_int8_avxvnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        return conv3x3s1_winograd43_int8_avx2(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_xop())
    {
        return conv3x3s1_winograd43_int8_xop(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43_int8 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                bool k_end = k + TILE_K >= K;

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk, k_end);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile_int8(top_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}